

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateSymbolName
          (DescriptorBuilder *this,string_view name,string_view full_name,Message *proto)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  string_view element_name;
  string_view element_name_00;
  Message *descriptor;
  bool bVar1;
  anon_class_8_1_898f2789 local_90;
  VoidPtr local_88;
  Invoker<std::__cxx11::basic_string<char>_> local_80;
  DescriptorBuilder *local_78;
  char *local_70;
  char local_61;
  const_iterator pvStack_60;
  char character;
  const_iterator __end3;
  const_iterator __begin3;
  string_view *__range3;
  size_t local_40;
  Message *local_38;
  Message *proto_local;
  DescriptorBuilder *this_local;
  string_view full_name_local;
  string_view name_local;
  
  full_name_local._M_len = (size_t)full_name._M_str;
  this_local = (DescriptorBuilder *)full_name._M_len;
  full_name_local._M_str = (char *)name._M_len;
  local_38 = proto;
  proto_local = (Message *)this;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&full_name_local._M_str);
  if (bVar1) {
    __range3 = (string_view *)this_local;
    local_40 = full_name_local._M_len;
    element_name_00._M_str = (char *)full_name_local._M_len;
    element_name_00._M_len = (size_t)this_local;
    AddError(this,element_name_00,local_38,NAME,"Missing name.");
  }
  else {
    __begin3 = (const_iterator)&full_name_local._M_str;
    __end3 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                       ((basic_string_view<char,_std::char_traits<char>_> *)__begin3);
    pvStack_60 = std::basic_string_view<char,_std::char_traits<char>_>::end
                           ((basic_string_view<char,_std::char_traits<char>_> *)__begin3);
    descriptor = local_38;
    for (; __end3 != pvStack_60; __end3 = __end3 + 1) {
      local_61 = *__end3;
      if ((((local_61 < 'a') || ('z' < local_61)) && ((local_61 < 'A' || ('Z' < local_61)))) &&
         (((local_61 < '0' || ('9' < local_61)) && (local_61 != '_')))) {
        local_78 = this_local;
        local_70 = (char *)full_name_local._M_len;
        local_90.name = (string_view *)&full_name_local._M_str;
        absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::ValidateSymbolName(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&)::__0,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_88,&local_90);
        element_name._M_str = local_70;
        element_name._M_len = (size_t)local_78;
        make_error.invoker_ = local_80;
        make_error.ptr_.obj = local_88.obj;
        AddError(this,element_name,descriptor,NAME,make_error);
        return;
      }
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateSymbolName(const absl::string_view name,
                                           const absl::string_view full_name,
                                           const Message& proto) {
  if (name.empty()) {
    AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
             "Missing name.");
  } else {
    for (char character : name) {
      // I don't trust isalnum() due to locales.  :(
      if ((character < 'a' || 'z' < character) &&
          (character < 'A' || 'Z' < character) &&
          (character < '0' || '9' < character) && (character != '_')) {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
          return absl::StrCat("\"", name, "\" is not a valid identifier.");
        });
        return;
      }
    }
  }
}